

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void test_fast_strcpy(void)

{
  char dest [32];
  
  dest[0x10] = '\0';
  dest[0x11] = '\0';
  dest[0x12] = '\0';
  dest[0x13] = '\0';
  dest[0x14] = '\0';
  dest[0x15] = '\0';
  dest[0x16] = '\0';
  dest[0x17] = '\0';
  dest[0] = '\0';
  dest[1] = '\0';
  dest[2] = '\0';
  dest[3] = '\0';
  dest[4] = '\0';
  dest[5] = '\0';
  dest[6] = '\0';
  dest[7] = '\0';
  dest[8] = '\0';
  dest[9] = '\0';
  dest[10] = '\0';
  dest[0xb] = '\0';
  dest[0xc] = '\0';
  dest[0xd] = '\0';
  dest[0xe] = '\0';
  dest[0xf] = '\0';
  dest[0x18] = 'x';
  dest[0x19] = '\0';
  dest[0x1a] = '\0';
  dest[0x1b] = '\0';
  dest[0x1c] = '\0';
  dest[0x1d] = '\0';
  dest[0x1e] = '\0';
  dest[0x1f] = '\0';
  fast_strcpy(dest,"rtosc is a good library",0x20);
  assert_str_eq("rtosc is a good library",dest,"fast_strcpy() copies at most <strlen> bytes",0xd);
  fast_strcpy(dest,"rtosc is a good library",0x20);
  assert_char_eq('x',dest[0x18],"fast_strcpy() does not pad the dest with zeros",0x11);
  fast_strcpy(dest,"rtosc is a good library",6);
  assert_str_eq("rtosc",dest,"fast_strcpy() copies at most <buffersize> bytes",0x15);
  return;
}

Assistant:

void test_fast_strcpy()
{
    const char* src = "rtosc is a good library";
    char dest[32];
    memset(dest, 0, sizeof(dest));
    dest[strlen(src)+1] = 'x';

    fast_strcpy(dest, src, 32);
    assert_str_eq(src, dest,
                  "fast_strcpy() copies at most <strlen> bytes", __LINE__);

    fast_strcpy(dest, src, 32);
    assert_char_eq('x', dest[strlen(src)+1],
                  "fast_strcpy() does not pad the dest with zeros", __LINE__);

    fast_strcpy(dest, src, 6);
    assert_str_eq("rtosc", dest,
                  "fast_strcpy() copies at most <buffersize> bytes", __LINE__);
}